

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

RegExp * __thiscall re2c::mkAlt(re2c *this,RegExp *e1,RegExp *e2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  re2c *prVar7;
  Range *pRVar8;
  RegExp *pRVar9;
  RegExp *e2_00;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<std::_Rb_tree_iterator<re2c::RegExp_*>,_bool> pVar15;
  re2c *local_30;
  
  if (this == (re2c *)0x0) {
    lVar10 = 0;
  }
  else {
    auVar12 = __dynamic_cast(this,&RegExp::typeinfo,&AltOp::typeinfo,0);
    e2 = auVar12._8_8_;
    lVar10 = auVar12._0_8_;
  }
  if (lVar10 == 0) {
    if (this == (re2c *)0x0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = e2;
      auVar12 = auVar2 << 0x40;
    }
    else {
      auVar12 = __dynamic_cast(this,&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    if (auVar12._0_8_ != 0) {
      this = (re2c *)0x0;
    }
  }
  else {
    if (*(long *)(lVar10 + 8) == 0) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = e2;
      auVar12 = auVar12 << 0x40;
    }
    else {
      auVar12 = __dynamic_cast(*(long *)(lVar10 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    if (auVar12._0_8_ == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = auVar12._8_8_;
      auVar12 = auVar1 << 0x40;
    }
    else {
      this = *(re2c **)(lVar10 + 0x10);
    }
  }
  lVar10 = auVar12._0_8_;
  if (e1 == (RegExp *)0x0) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar12._8_8_;
    auVar13 = auVar13 << 0x40;
  }
  else {
    auVar13 = __dynamic_cast(e1,&RegExp::typeinfo,&AltOp::typeinfo,0);
  }
  lVar11 = auVar13._0_8_;
  if (lVar11 == 0) {
    if (e1 == (RegExp *)0x0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar13._8_8_;
      auVar14 = auVar4 << 0x40;
    }
    else {
      auVar14 = __dynamic_cast(e1,&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    if (auVar14._0_8_ != 0) {
      e1 = (RegExp *)0x0;
    }
  }
  else {
    if (*(long *)(lVar11 + 8) == 0) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auVar13._8_8_;
      auVar14 = auVar14 << 0x40;
    }
    else {
      auVar14 = __dynamic_cast(*(long *)(lVar11 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
    }
    if (auVar14._0_8_ == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = auVar14._8_8_;
      auVar14 = auVar3 << 0x40;
    }
    else {
      e1 = *(RegExp **)(lVar11 + 0x10);
    }
  }
  auVar6._8_8_ = auVar14._8_8_;
  auVar6._0_8_ = lVar10;
  auVar5 = auVar14;
  if ((lVar10 != 0) && (auVar5 = auVar6, auVar14._0_8_ != 0)) {
    prVar7 = (re2c *)operator_new(0x10);
    pRVar8 = Range::add(*(Range **)(lVar10 + 8),*(Range **)(auVar14._0_8_ + 8));
    *(undefined ***)prVar7 = &PTR__RegExp_0015cd10;
    local_30 = prVar7;
    pVar15 = std::
             _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
             ::_M_insert_unique<re2c::RegExp*>
                       ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                         *)RegExp::vFreeList,(RegExp **)&local_30);
    auVar5._8_8_ = pVar15._8_8_;
    auVar5._0_8_ = prVar7;
    *(undefined ***)prVar7 = &PTR__RegExp_0015cbf0;
    *(Range **)(prVar7 + 8) = pRVar8;
  }
  pRVar9 = doAlt(this,e1,auVar5._8_8_);
  pRVar9 = doAlt(auVar5._0_8_,pRVar9,e2_00);
  return pRVar9;
}

Assistant:

RegExp * mkAlt (RegExp * e1, RegExp * e2)
{
	AltOp * a;
	MatchOp * m1;
	MatchOp * m2;

	a = dynamic_cast<AltOp*> (e1);
	if (a != NULL)
	{
		m1 = dynamic_cast<MatchOp*> (a->exp1);
		if (m1 != NULL)
		{
			e1 = a->exp2;
		}
	}
	else
	{
		m1 = dynamic_cast<MatchOp*> (e1);
		if (m1 != NULL)
		{
			e1 = NULL;
		}
	}
	a = dynamic_cast<AltOp*> (e2);
	if (a != NULL)
	{
		m2 = dynamic_cast<MatchOp*> (a->exp1);
		if (m2 != NULL)
		{
			e2 = a->exp2;
		}
	}
	else
	{
		m2 = dynamic_cast<MatchOp*> (e2);
		if (m2 != NULL)
		{
			e2 = NULL;
		}
	}

	return doAlt (merge (m1, m2), doAlt (e1, e2));
}